

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

bool __thiscall HttpContext::ParseRequest(HttpContext *this,BufferPtr *buf,uint64_t receive_time)

{
  uint uVar1;
  element_type *peVar2;
  char local_851;
  char *local_850;
  char *colon;
  char *end;
  uint32_t size_1;
  uint32_t need_len_1;
  char line_buf_1 [1024];
  undefined4 local_42c;
  uint32_t size;
  uint32_t need_len;
  char line_buf [1024];
  bool hasMore;
  bool ok;
  uint64_t receive_time_local;
  BufferPtr *buf_local;
  HttpContext *this_local;
  
  line_buf[0x3ff] = '\x01';
  line_buf[0x3fe] = '\x01';
  while ((line_buf[0x3fe] & 1U) != 0) {
    if (this->_state == ExpectRequestLine) {
      memset(&size,0,0x400);
      local_42c = 0;
      peVar2 = std::__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buf);
      uVar1 = (*peVar2->_vptr_Buffer[7])(peVar2,&size,0x400,"\r\n",2,&local_42c);
      if (uVar1 == 0) {
        line_buf[0x3fe] = '\0';
      }
      else {
        line_buf[0x3ff] =
             processRequestLine(this,(char *)&size,(char *)((long)&size + (ulong)uVar1));
        if ((bool)line_buf[0x3ff]) {
          HttpRequest::SetReceiveTime(&this->_request,receive_time);
          this->_state = ExpectHeaders;
        }
        else {
          line_buf[0x3fe] = '\0';
        }
      }
    }
    else if (this->_state == ExpectHeaders) {
      memset(&size_1,0,0x400);
      end._4_4_ = 0;
      peVar2 = std::__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buf);
      end._0_4_ = (*peVar2->_vptr_Buffer[7])(peVar2,&size_1,0x400,"\r\n",2,(long)&end + 4);
      colon = (char *)((long)&end + (ulong)(uint)end + 6);
      if ((uint)end == 0) {
        line_buf[0x3fe] = '\0';
      }
      else {
        local_851 = ':';
        local_850 = std::find<char*,char>((char *)&size_1,colon,&local_851);
        if (local_850 == colon) {
          this->_state = GotAll;
          line_buf[0x3fe] = '\0';
        }
        else {
          HttpRequest::AddHeader(&this->_request,(char *)&size_1,local_850,colon);
        }
      }
    }
  }
  return (bool)(line_buf[0x3ff] & 1);
}

Assistant:

bool HttpContext::ParseRequest(cppnet::BufferPtr buf, uint64_t receive_time) {
    bool ok = true;
    bool hasMore = true;
    while (hasMore) {
        if (_state == ExpectRequestLine) {
            char line_buf[1024] = {0};
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            if (size > 0) {
                ok = processRequestLine(line_buf, line_buf + size);
                if (ok) {
                    _request.SetReceiveTime(receive_time);
                    _state = ExpectHeaders;

                } else {
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectHeaders) {
            char line_buf[1024] = { 0 };
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            char* end = line_buf + size - CRLF_LEN;
            if (size > 0) {
                const char* colon = std::find(line_buf, end, ':');
                if (colon != end) {
                    _request.AddHeader(line_buf, colon, end);

                } else {
                    // empty line, end of header
                    // FIXME:
                    _state = GotAll;
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectBody) {
            // TODO:
        }
    }
    return ok;
}